

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_abs<double>(uint length)

{
  _func_int **pp_Var1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  undefined8 *puVar12;
  long lVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  uint uVar15;
  uint uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  shared_ptr<double> pv;
  uint uStack_38;
  uint local_34;
  
  iVar11 = posix_memalign(&pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x10,(long)(int)length << 3);
  _Var17 = pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (iVar11 != 0) {
    _Var17._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,_Var17._M_pi,
             sse::common::free<double>);
  uVar18 = (ulong)length;
  if (0 < (int)length) {
    lVar13 = 0;
    p_Var14 = _Var17._M_pi;
    do {
      p_Var14->_vptr__Sp_counted_base = (_func_int **)(double)(int)lVar13;
      lVar13 = lVar13 + -1;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var14->_M_use_count;
    } while (-lVar13 != uVar18);
  }
  p_Var14 = _Var17._M_pi;
  uVar15 = length;
  local_34 = length;
  uVar16 = length;
  if (3 < (int)length) {
    do {
      pp_Var1 = p_Var14->_vptr__Sp_counted_base;
      uVar21._0_4_ = p_Var14->_M_use_count;
      uVar21._4_4_ = p_Var14->_M_weak_count;
      uVar6 = *(uint *)&p_Var14[1]._vptr__Sp_counted_base;
      uVar7 = *(uint *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      uVar19 = *(uint *)&p_Var14[2]._vptr__Sp_counted_base;
      uVar20 = *(uint *)((long)&p_Var14[2]._vptr__Sp_counted_base + 4);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        test_abs<double>();
        uStack_38 = uVar19;
        local_34 = uVar20;
        uVar16 = uVar20;
      }
      uVar3 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                       sse::internals::abs_pd(double(int))::sign_mask._0_4_);
      uVar10 = CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                        sse::internals::abs_pd(double(int))::sign_mask._8_4_);
      if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
        test_abs<double>();
        uVar19 = uStack_38;
        uVar20 = local_34;
        uVar16 = local_34;
      }
      uVar21 = ~uVar10 & uVar21;
      uVar8 = ~sse::internals::abs_pd(double(int))::sign_mask._0_4_;
      uVar9 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
      uVar4 = ~sse::internals::abs_pd(double(int))::sign_mask._8_4_;
      uVar5 = ~sse::internals::abs_pd(double(int))::sign_mask._12_4_;
      p_Var14->_vptr__Sp_counted_base = (_func_int **)(~uVar3 & (ulong)pp_Var1);
      p_Var14->_M_use_count = (int)uVar21;
      p_Var14->_M_weak_count = (int)(uVar21 >> 0x20);
      *(uint *)&p_Var14[1]._vptr__Sp_counted_base = uVar8 & uVar6;
      *(uint *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4) = uVar9 & uVar7;
      p_Var14[1]._M_use_count = uVar4 & uVar19;
      p_Var14[1]._M_weak_count = uVar5 & uVar20;
      length = uVar15 - 4;
      p_Var14 = p_Var14 + 2;
      bVar2 = 7 < (int)uVar15;
      uVar15 = length;
    } while (bVar2);
  }
  if (1 < (int)length) {
    uVar15 = *(uint *)&p_Var14->_vptr__Sp_counted_base;
    uVar19 = *(uint *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    uVar3._0_4_ = p_Var14->_M_use_count;
    uVar3._4_4_ = p_Var14->_M_weak_count;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_abs<double>();
      uVar16 = local_34;
    }
    uVar20 = ~sse::internals::abs_pd(double(int))::sign_mask._4_4_;
    uVar3 = ~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._12_4_,
                      sse::internals::abs_pd(double(int))::sign_mask._8_4_) & uVar3;
    *(uint *)&p_Var14->_vptr__Sp_counted_base =
         ~sse::internals::abs_pd(double(int))::sign_mask._0_4_ & uVar15;
    *(uint *)((long)&p_Var14->_vptr__Sp_counted_base + 4) = uVar20 & uVar19;
    p_Var14->_M_use_count = (_Atomic_word)uVar3;
    p_Var14->_M_weak_count = (_Atomic_word)(uVar3 >> 0x20);
    length = length - 2;
    p_Var14 = p_Var14 + 1;
  }
  if (length != 0) {
    pp_Var1 = p_Var14->_vptr__Sp_counted_base;
    if (sse::internals::abs_pd(double(int))::sign_mask == '\0') {
      test_abs<double>();
      uVar16 = local_34;
    }
    p_Var14->_vptr__Sp_counted_base =
         (_func_int **)
         (~CONCAT44(sse::internals::abs_pd(double(int))::sign_mask._4_4_,
                    sse::internals::abs_pd(double(int))::sign_mask._0_4_) & (ulong)pp_Var1);
  }
  if (0 < (int)uVar16) {
    uVar21 = 0;
    do {
      pp_Var1 = (&(_Var17._M_pi)->_vptr__Sp_counted_base)[uVar21];
      if (((double)pp_Var1 < 0.0) &&
         (((double)pp_Var1 != 2.2250738585072014e-308 || (NAN((double)pp_Var1))))) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar12 = "void test_abs(unsigned int) [T = double]";
        *(undefined4 *)(puVar12 + 1) = 0x81;
        *(uint *)((long)puVar12 + 0xc) = uVar16;
        __cxa_throw(puVar12,&Exception::typeinfo,0);
      }
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
  }
  if (pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}